

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O2

xml_attribute __thiscall
pugi::xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
          (xml_node *this,namespace_uri_predicate pred)

{
  bool bVar1;
  xml_attribute_struct *in_RAX;
  char_t *string;
  xml_attribute local_38;
  
  local_38._attr = in_RAX;
  if (this->_root != (xml_node_struct *)0x0) {
    local_38 = first_attribute(this);
    while (local_38._attr != (xml_attribute_struct *)0x0) {
      string = (local_38._attr)->name;
      if (string == (char_t *)0x0) {
        string = "";
      }
      bVar1 = impl::anon_unknown_0::starts_with(string,"xmlns");
      if (bVar1) {
        if (pred.prefix == (char_t *)0x0) {
          if (string[5] == '\0') {
            return (xml_attribute)local_38._attr;
          }
        }
        else if ((string[5] == ':') &&
                (bVar1 = impl::anon_unknown_0::strequalrange
                                   (string + 6,pred.prefix,pred.prefix_length), bVar1)) {
          return (xml_attribute)local_38._attr;
        }
      }
      local_38 = xml_attribute::next_attribute(&local_38);
    }
  }
  xml_attribute::xml_attribute(&local_38);
  return (xml_attribute)local_38._attr;
}

Assistant:

xml_attribute find_attribute(Predicate pred) const
		{
			if (!_root) return xml_attribute();

			for (xml_attribute attrib = first_attribute(); attrib; attrib = attrib.next_attribute())
				if (pred(attrib))
					return attrib;

			return xml_attribute();
		}